

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::CheckFlipFlopAlwaysFFVisitor::check_always_ff(SequentialStmtBlock *stmt)

{
  pointer psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar3;
  StmtException *this_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  initializer_list<kratos::IRNode_*> __l;
  SequentialStmtBlock *local_78;
  string local_70;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_50;
  allocator_type local_31;
  
  lVar4 = (long)(stmt->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(stmt->super_StmtBlock).stmts_.
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar5 = 8;
    bVar3 = false;
    uVar6 = 1;
    do {
      psVar1 = (stmt->super_StmtBlock).stmts_.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)psVar1 + lVar5 + -8);
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar1->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              + lVar5);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (*(int *)(lVar2 + 0x78) == 0) {
        bVar3 = true;
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (bVar3) break;
      lVar5 = lVar5 + 0x10;
      bVar7 = uVar6 < (ulong)(lVar4 >> 4);
      uVar6 = uVar6 + 1;
    } while (bVar7);
    if ((bVar3) &&
       (0x10 < (ulong)((long)(stmt->super_StmtBlock).stmts_.
                             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(stmt->super_StmtBlock).stmts_.
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_start))) {
      this_00 = (StmtException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,anon_var_dwarf_85da69,anon_var_dwarf_85da69 + 0xb2);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_78;
      local_78 = stmt;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_50,__l,&local_31);
      StmtException::StmtException(this_00,&local_70,&local_50);
      __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void static check_always_ff(SequentialStmtBlock* stmt) {
        // first pass to determine if there is any if statement in top level
        bool has_if = false;
        uint64_t i = 0;
        uint64_t stmt_count = stmt->size();
        while ((!has_if) && (i < stmt_count)) {
            auto s = stmt->get_stmt(i);
            if (s->type() == StatementType::If) has_if = true;
            i++;
        }
        if (has_if && stmt->size() > 1) {
            // DC cannot infer as a D-flip-flop
            // error message copied from DC
            throw StmtException(
                "The statements in this 'always' block are outside the "
                "scope of the synthesis policy. Only an ’if’ statement "
                "is allowed at the top level in this ’always’ block. (ELAB-302)",
                {stmt});
        }
    }